

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_draw_update(t_gobj *client,_glist *glist)

{
  int iVar1;
  size_t sVar2;
  undefined4 local_cc;
  undefined1 *puStack_b0;
  int sl;
  char *cp;
  char tag [128];
  _glist *canvas;
  t_my_numbox *x;
  _glist *glist_local;
  t_gobj *client_local;
  
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    tag._120_8_ = glist_getcanvas(glist);
    sprintf((char *)&cp,"%lxNUMBER",client);
    if ((*(uint *)&client[0x44].g_pd >> 0x1b & 1) == 0) {
      my_numbox_ftoa((t_my_numbox *)client);
      if ((*(uint *)&client[0x44].g_pd >> 0x18 & 1) == 0) {
        local_cc = *(undefined4 *)((long)&client[0x44].g_next + 4);
      }
      else {
        local_cc = 0xff;
      }
      pdgui_vmess((char *)0x0,"crs rk rs",tag._120_8_,"itemconfigure",&cp,"-fill",local_cc,"-text",
                  (undefined1 *)((long)&client[0x4c].g_pd + 4));
      *(undefined1 *)((long)&client[0x4c].g_pd + 4) = 0;
    }
    else if (*(char *)((long)&client[0x4c].g_pd + 4) == '\0') {
      my_numbox_ftoa((t_my_numbox *)client);
      pdgui_vmess((char *)0x0,"crs rk rs",tag._120_8_,"itemconfigure",&cp,"-fill",0xff0000,"-text",
                  (undefined1 *)((long)&client[0x4c].g_pd + 4));
      *(undefined1 *)((long)&client[0x4c].g_pd + 4) = 0;
    }
    else {
      puStack_b0 = (undefined1 *)((long)&client[0x4c].g_pd + 4);
      sVar2 = strlen((char *)((long)&client[0x4c].g_pd + 4));
      iVar1 = (int)sVar2;
      *(undefined1 *)((long)&client[0x4c].g_pd + (long)iVar1 + 4) = 0x3e;
      *(undefined1 *)((long)&client[0x4c].g_pd + (long)(iVar1 + 1) + 4) = 0;
      if (*(int *)((long)&client[0x4e].g_pd + 4) <= iVar1) {
        puStack_b0 = puStack_b0 + ((iVar1 - *(int *)((long)&client[0x4e].g_pd + 4)) + 1);
      }
      pdgui_vmess((char *)0x0,"crs rk rs",tag._120_8_,"itemconfigure",&cp,"-fill",0xff0000,"-text",
                  puStack_b0);
      *(undefined1 *)((long)&client[0x4c].g_pd + (long)iVar1 + 4) = 0;
    }
  }
  return;
}

Assistant:

static void my_numbox_draw_update(t_gobj *client, t_glist *glist)
{
    t_my_numbox *x = (t_my_numbox *)client;
    if(glist_isvisible(glist))
    {
        t_canvas *canvas = glist_getcanvas(glist);
        char tag[128];
        sprintf(tag, "%lxNUMBER", x);
        if(x->x_gui.x_fsf.x_change)
        {
            if(x->x_buf[0])
            {
                char *cp = x->x_buf;
                int sl = (int)strlen(x->x_buf);

                x->x_buf[sl] = '>';
                x->x_buf[sl+1] = 0;
                if(sl >= x->x_numwidth)
                    cp += sl - x->x_numwidth + 1;
                pdgui_vmess(0, "crs rk rs", canvas, "itemconfigure", tag,
                    "-fill", IEM_GUI_COLOR_EDITED, "-text", cp);
                x->x_buf[sl] = 0;
            }
            else
            {
                my_numbox_ftoa(x);
                pdgui_vmess(0, "crs rk rs", canvas, "itemconfigure", tag,
                    "-fill", IEM_GUI_COLOR_EDITED, "-text", x->x_buf);
                x->x_buf[0] = 0;
            }
        }
        else
        {
            my_numbox_ftoa(x);
                pdgui_vmess(0, "crs rk rs", canvas, "itemconfigure", tag,
                    "-fill", (x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_fcol),
                    "-text", x->x_buf);
            x->x_buf[0] = 0;
        }
    }
}